

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModbusAnalyzerSettings.cpp
# Opt level: O1

void __thiscall ModbusAnalyzerSettings::LoadSettings(ModbusAnalyzerSettings *this,char *settings)

{
  char cVar1;
  int iVar2;
  SimpleArchive text_archive;
  ParityAndStopbits parity;
  Mode mode;
  char *name_string;
  SimpleArchive local_30 [8];
  ParityAndStopbits local_28;
  Mode local_24;
  char *local_20;
  
  SimpleArchive::SimpleArchive(local_30);
  SimpleArchive::SetString((char *)local_30);
  SimpleArchive::operator>>(local_30,&local_20);
  iVar2 = strcmp(local_20,"ModbusAnalyzerSettings");
  if (iVar2 != 0) {
    iVar2 = strcmp(local_20,"SaleaeAsyncModbusAnalyzer");
    if (iVar2 != 0) {
      AnalyzerHelpers::Assert
                (
                "ModbusAnalyzerSettings: Provided with a settings string that doesn\'t belong to us;"
                );
    }
  }
  SimpleArchive::operator>>(local_30,&this->mInputChannel);
  SimpleArchive::operator>>(local_30,&this->mBitRate);
  SimpleArchive::operator>>(local_30,&this->mInverted);
  cVar1 = SimpleArchive::operator>>(local_30,&local_24);
  if (cVar1 != '\0') {
    this->mModbusMode = local_24;
  }
  cVar1 = SimpleArchive::operator>>(local_30,&local_28);
  if (cVar1 != '\0') {
    this->mParity = local_28;
  }
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mInputChannel,true);
  UpdateInterfacesFromSettings(this);
  SimpleArchive::~SimpleArchive(local_30);
  return;
}

Assistant:

void ModbusAnalyzerSettings::LoadSettings( const char* settings )
{
    // Example: $3 = 0x1647478 "22 serialization::archive 5 22 ModbusAnalyzerSettings 0 8 1324695933 0 9600"
    SimpleArchive text_archive;
    text_archive.SetString( settings );

    const char* name_string; // the first thing in the archive is the name of the protocol analyzer that the data belongs to.
    text_archive >> &name_string;
    if( strcmp( name_string, "ModbusAnalyzerSettings" ) != 0 )
    {
        if( strcmp( name_string, "SaleaeAsyncModbusAnalyzer" ) != 0 )
        { // The old string; treat them the same for now.
            AnalyzerHelpers::Assert( "ModbusAnalyzerSettings: Provided with a settings string that doesn't belong to us;" );
        }
    }
    text_archive >> mInputChannel;
    text_archive >> mBitRate;
    // text_archive >> mBitsPerTransfer;
    // text_archive >> mStopBits;
    // text_archive >> *(U32*)&mParity;
    // text_archive >> *(U32*)&mShiftOrder;
    text_archive >> mInverted;

    // check to make sure loading it actual works befor assigning the result -- do this when adding settings to an anylzer which has been
    // previously released. bool use_autobaud; if( text_archive >> use_autobaud ) 	mUseAutobaud = use_autobaud;

    ModbusAnalyzerEnums::Mode mode;
    if( text_archive >> *( U32* )&mode )
        mModbusMode = mode;

    // added for 1.2.14
    ModbusAnalyzerEnums::ParityAndStopbits parity;
    if( text_archive >> *( U32* )&parity )
        mParity = parity;


    ClearChannels();
    AddChannel( mInputChannel, "Modbus", true );

    UpdateInterfacesFromSettings();
}